

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_in_place_glob(REF_INT n,REF_GLOB *sorts)

{
  REF_STATUS RVar1;
  REF_INT *sorted_index;
  void *__src;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  ulong uVar5;
  
  RVar1 = 0;
  if (1 < n) {
    uVar5 = (ulong)(uint)n;
    sorted_index = (REF_INT *)malloc(uVar5 * 4);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar4 = "malloc order of REF_INT NULL";
      uVar3 = 199;
    }
    else {
      __src = malloc(uVar5 * 8);
      if (__src != (void *)0x0) {
        ref_sort_heap_glob(n,sorts,sorted_index);
        uVar2 = 0;
        do {
          *(REF_GLOB *)((long)__src + uVar2 * 8) = sorts[sorted_index[uVar2]];
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
        memcpy(sorts,__src,uVar5 << 3);
        free(__src);
        free(sorted_index);
        return 0;
      }
      pcVar4 = "malloc sorted of REF_GLOB NULL";
      uVar3 = 200;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",uVar3,
           "ref_sort_in_place_glob",pcVar4);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_sort_in_place_glob(REF_INT n, REF_GLOB *sorts) {
  REF_INT i;
  REF_INT *order;
  REF_GLOB *sorted;

  /* see if it is too short to require sorting */
  if (2 > n) return REF_SUCCESS;
  ref_malloc(order, n, REF_INT);
  ref_malloc(sorted, n, REF_GLOB);
  RSS(ref_sort_heap_glob(n, sorts, order), "heap");
  for (i = 0; i < n; i++) {
    sorted[i] = sorts[order[i]];
  }
  for (i = 0; i < n; i++) {
    sorts[i] = sorted[i];
  }
  ref_free(sorted);
  ref_free(order);
  return REF_SUCCESS;
}